

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

vbool<4> __thiscall
embree::sse42::InstanceArrayIntersectorK<4>::occluded
          (InstanceArrayIntersectorK<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RTCRayQueryContext *pRVar6;
  long *plVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  long lVar24;
  Geometry *extraout_RDX;
  Geometry *pGVar25;
  int iVar26;
  InstanceArrayIntersectorK<4> *pIVar27;
  float fVar28;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar38;
  float fVar39;
  vfloat4 l02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar46;
  vfloat4 v_1;
  undefined1 auVar42 [16];
  float fVar45;
  float fVar47;
  undefined1 auVar43 [16];
  float fVar48;
  float fVar53;
  float fVar54;
  undefined1 in_XMM4 [16];
  vfloat4 v;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 in_XMM8 [16];
  vfloat4 a0;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 in_XMM11 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  vbool<4> vVar79;
  RayQueryContext newcontext;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_48 [16];
  long local_30;
  RTCRayQueryContext *local_28;
  RTCIntersectArguments *local_20;
  undefined1 auVar49 [16];
  
  uVar2 = mm_lookupmask_ps._8_8_;
  auVar59 = in_XMM6._0_12_;
  uVar3 = prim->primID_;
  uVar4 = prim->instID_;
  pGVar25 = (context->scene->geometries).items[uVar4].ptr;
  local_30 = *(long *)&pGVar25->field_0x58;
  pIVar27 = this;
  if (local_30 == 0) {
    uVar23 = (ulong)*(uint *)(*(long *)&pGVar25[1].time_range.upper +
                             (long)pGVar25[1].intersectionFilterN * (ulong)uVar3);
    if (uVar23 != 0xffffffff) {
      pIVar27 = (InstanceArrayIntersectorK<4> *)pGVar25[1].super_RefCount._vptr_RefCount;
      local_30 = *(long *)(pIVar27 + uVar23 * 8);
      if (local_30 != 0) goto LAB_002b07b2;
    }
  }
  else {
LAB_002b07b2:
    uVar5 = pGVar25->mask;
    auVar51._4_4_ = uVar5;
    auVar51._0_4_ = uVar5;
    auVar51._8_4_ = uVar5;
    auVar51._12_4_ = uVar5;
    auVar35 = auVar51 & *(undefined1 (*) [16])(ray + 0x90);
    auVar57._0_4_ = -(uint)(auVar35._0_4_ == 0);
    auVar57._4_4_ = -(uint)(auVar35._4_4_ == 0);
    auVar57._8_4_ = -(uint)(auVar35._8_4_ == 0);
    auVar57._12_4_ = -(uint)(auVar35._12_4_ == 0);
    local_48 = ~auVar57 & (undefined1  [16])valid_i->field_0;
    iVar26 = movmskps((int)pIVar27,local_48);
    if (iVar26 != 0) {
      pRVar6 = context->user;
      auVar30._8_8_ = mm_lookupmask_ps._8_8_;
      auVar30._0_8_ = mm_lookupmask_ps._0_8_;
      *(undefined1 (*) [16])this = auVar30;
      if (pRVar6->instID[0] == 0xffffffff) {
        pRVar6->instID[0] = uVar4;
        pRVar6->instPrimID[0] = uVar3;
        uVar23 = (ulong)prim->primID_;
        plVar7 = *(long **)&pGVar25[1].fnumTimeSegments;
        iVar26 = (int)plVar7[4];
        if ((pGVar25->field_8).field_0x1 == '\x01') {
          if (iVar26 == 0x9134) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x10 + lVar24),0x1c);
            auVar30 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x20 + lVar24),0x28);
            auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x14 + lVar24),0x1c);
            auVar35 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x24 + lVar24),0x28);
            auVar57 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x18 + lVar24),0x1c);
            in_XMM11 = insertps(auVar57,*(undefined4 *)(lVar8 + 0x28 + lVar24),0x28);
            auVar57 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                               *(undefined4 *)(lVar8 + 0x1c + lVar24),0x1c);
            in_XMM4 = insertps(auVar57,*(undefined4 *)(lVar8 + 0x2c + lVar24),0x28);
          }
          else if (iVar26 == 0x9234) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            uVar2 = *(undefined8 *)(lVar8 + 4 + lVar24);
            auVar30._4_4_ = (float)(int)uVar2;
            auVar30._0_4_ = (float)*(undefined4 *)(lVar8 + lVar24);
            auVar30._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
            auVar30._12_4_ = 0.0;
            uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar24);
            auVar35._4_4_ = (int)uVar2;
            auVar35._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar24);
            auVar35._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar35._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
            in_XMM11._4_4_ = (int)uVar2;
            in_XMM11._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
            in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM11._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar24);
            in_XMM4._4_4_ = (int)uVar2;
            in_XMM4._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar24);
            in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM4._12_4_ = 0;
          }
          else if (iVar26 == 0xb001) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar24);
            auVar57 = insertps(auVar74,*(undefined4 *)(lVar8 + 8 + lVar24),0x20);
            uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar24);
            auVar32._4_4_ = (int)uVar2;
            auVar32._0_4_ = *(undefined4 *)(lVar8 + lVar24);
            auVar32._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar32._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
            auVar52._4_4_ = (int)uVar2;
            auVar52._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
            auVar52._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar52._12_4_ = 0;
            fVar28 = *(float *)(lVar8 + 0x24 + lVar24);
            fVar41 = *(float *)(lVar8 + 0x28 + lVar24);
            fVar33 = *(float *)(lVar8 + 0x2c + lVar24);
            fVar44 = *(float *)(lVar8 + 0x30 + lVar24);
            fVar62 = fVar44 * fVar44 + fVar33 * fVar33 + fVar28 * fVar28 + fVar41 * fVar41;
            auVar35 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
            fVar46 = auVar35._0_4_;
            auVar43._4_12_ = auVar35._4_12_;
            fVar46 = fVar46 * fVar46 * fVar62 * -0.5 * fVar46 + fVar46 * 1.5;
            in_XMM4 = insertps(auVar52,ZEXT416((uint)(fVar28 * fVar46)),0x30);
            auVar30 = insertps(auVar32,ZEXT416((uint)(fVar41 * fVar46)),0x30);
            auVar43._0_4_ = fVar46 * fVar44;
            auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                               *(undefined4 *)(lVar8 + 4 + lVar24),0x10);
            in_XMM11 = insertps(auVar57,auVar43,0x30);
            auVar35 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x3c + lVar24),0x20);
            auVar35 = insertps(auVar35,ZEXT416((uint)(fVar33 * fVar46)),0x30);
          }
          else if (iVar26 == 0x9244) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar30 = *(undefined1 (*) [16])(lVar8 + lVar24);
            auVar35 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar24);
            in_XMM11 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar24);
            in_XMM4 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar24);
          }
          fVar62 = in_XMM4._12_4_;
          fVar28 = auVar30._0_4_;
          fVar41 = auVar30._12_4_;
          fVar33 = auVar35._4_4_;
          fVar44 = auVar35._12_4_;
          fVar58 = in_XMM11._12_4_;
          fVar75 = fVar41 * fVar44 + fVar58 * fVar62;
          fVar61 = fVar41 * fVar44 - fVar58 * fVar62;
          fVar65 = fVar62 * fVar62 + fVar41 * fVar41 + -fVar44 * fVar44 + -fVar58 * fVar58;
          fVar77 = fVar62 * fVar62 - fVar41 * fVar41;
          fVar73 = fVar44 * fVar44 + fVar77 + -fVar58 * fVar58;
          fVar78 = fVar41 * fVar58 - fVar44 * fVar62;
          fVar46 = fVar44 * fVar62 + fVar41 * fVar58;
          fVar76 = fVar44 * fVar58 + fVar41 * fVar62;
          fVar63 = fVar44 * fVar58 - fVar41 * fVar62;
          fVar75 = fVar75 + fVar75;
          fVar78 = fVar78 + fVar78;
          fVar58 = fVar58 * fVar58 + fVar77 + -fVar44 * fVar44;
          fVar66 = fVar65 * 1.0 + fVar75 * 0.0 + fVar78 * 0.0;
          fVar69 = fVar65 * 0.0 + fVar75 * 1.0 + fVar78 * 0.0;
          fVar71 = fVar65 * 0.0 + fVar75 * 0.0 + fVar78 * 1.0;
          fVar78 = fVar65 * 0.0 + fVar75 * 0.0 + fVar78 * 0.0;
          fVar76 = fVar76 + fVar76;
          fVar61 = fVar61 + fVar61;
          fVar65 = fVar61 * 1.0 + fVar73 * 0.0 + fVar76 * 0.0;
          fVar75 = fVar61 * 0.0 + fVar73 * 1.0 + fVar76 * 0.0;
          fVar77 = fVar61 * 0.0 + fVar73 * 0.0 + fVar76 * 1.0;
          fVar61 = fVar61 * 0.0 + fVar73 * 0.0 + fVar76 * 0.0;
          auVar72._0_8_ = auVar30._4_8_;
          auVar72._8_8_ = 0;
          auVar57 = blendps(auVar72,auVar35,4);
          fVar46 = fVar46 + fVar46;
          fVar63 = fVar63 + fVar63;
          fVar41 = fVar46 * 1.0 + fVar63 * 0.0 + fVar58 * 0.0;
          fVar44 = fVar46 * 0.0 + fVar63 * 1.0 + fVar58 * 0.0;
          fVar62 = fVar46 * 0.0 + fVar63 * 0.0 + fVar58 * 1.0;
          fVar46 = fVar46 * 0.0 + fVar63 * 0.0 + fVar58 * 0.0;
          local_a8._0_4_ = in_XMM11._0_4_;
          local_a8._4_4_ = in_XMM11._4_4_;
          uStack_a0._0_4_ = in_XMM11._8_4_;
          local_98._0_4_ = in_XMM4._0_4_;
          local_98._4_4_ = in_XMM4._4_4_;
          uStack_90._0_4_ = in_XMM4._8_4_;
          fVar58 = fVar46 * 0.0;
          auVar30._0_4_ = fVar28 * fVar66 + fVar65 * 0.0 + fVar41 * 0.0;
          auVar30._4_4_ = fVar28 * fVar69 + fVar75 * 0.0 + fVar44 * 0.0;
          auVar30._8_4_ = fVar28 * fVar71 + fVar77 * 0.0 + fVar62 * 0.0;
          auVar30._12_4_ = fVar28 * fVar78 + fVar61 * 0.0 + fVar58;
          fVar28 = auVar35._0_4_;
          in_XMM8._0_4_ = fVar28 * fVar66 + fVar33 * fVar65 + fVar41 * 0.0;
          in_XMM8._4_4_ = fVar28 * fVar69 + fVar33 * fVar75 + fVar44 * 0.0;
          in_XMM8._8_4_ = fVar28 * fVar71 + fVar33 * fVar77 + fVar62 * 0.0;
          in_XMM8._12_4_ = fVar28 * fVar78 + fVar33 * fVar61 + fVar58;
          in_XMM5._0_4_ =
               (float)local_a8 * fVar66 + local_a8._4_4_ * fVar65 + (float)uStack_a0 * fVar41;
          in_XMM5._4_4_ =
               (float)local_a8 * fVar69 + local_a8._4_4_ * fVar75 + (float)uStack_a0 * fVar44;
          in_XMM5._8_4_ =
               (float)local_a8 * fVar71 + local_a8._4_4_ * fVar77 + (float)uStack_a0 * fVar62;
          in_XMM5._12_4_ =
               (float)local_a8 * fVar78 + local_a8._4_4_ * fVar61 + (float)uStack_a0 * fVar46;
          auVar59._0_4_ =
               (float)local_98 * fVar66 + local_98._4_4_ * fVar65 + (float)uStack_90 * fVar41 +
               auVar57._0_4_ + 0.0;
          auVar59._4_4_ =
               (float)local_98 * fVar69 + local_98._4_4_ * fVar75 + (float)uStack_90 * fVar44 +
               auVar57._4_4_ + 0.0;
          auVar59._8_4_ =
               (float)local_98 * fVar71 + local_98._4_4_ * fVar77 + (float)uStack_90 * fVar62 +
               auVar57._8_4_ + 0.0;
        }
        else if (iVar26 == 0x9134) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar24),0x1c);
          auVar30 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x20 + lVar24),0x28);
          auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar24),0x1c);
          in_XMM8 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x24 + lVar24),0x28);
          auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar24),0x1c);
          in_XMM5 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x28 + lVar24),0x28);
          auVar35 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar24),0x1c);
          auVar35 = insertps(auVar35,*(undefined4 *)(lVar8 + 0x2c + lVar24),0x28);
          auVar59 = auVar35._0_12_;
        }
        else if (iVar26 == 0x9234) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          uVar2 = *(undefined8 *)(lVar8 + 4 + lVar24);
          auVar30._4_4_ = (float)(int)uVar2;
          auVar30._0_4_ = (float)*(undefined4 *)(lVar8 + lVar24);
          auVar30._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          auVar30._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar24);
          in_XMM8._4_4_ = (float)(int)uVar2;
          in_XMM8._0_4_ = (float)*(undefined4 *)(lVar8 + 0xc + lVar24);
          in_XMM8._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM8._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
          in_XMM5._4_4_ = (float)(int)uVar2;
          in_XMM5._0_4_ = (float)*(undefined4 *)(lVar8 + 0x18 + lVar24);
          in_XMM5._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM5._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar24);
          auVar59._4_4_ = (float)(int)uVar2;
          auVar59._0_4_ = (float)*(undefined4 *)(lVar8 + 0x24 + lVar24);
          auVar59._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar26 == 0xb001) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar24);
          auVar35 = insertps(auVar55,*(undefined4 *)(lVar8 + 8 + lVar24),0x20);
          uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar24);
          auVar29._4_4_ = (int)uVar2;
          auVar29._0_4_ = *(undefined4 *)(lVar8 + lVar24);
          auVar29._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar29._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
          auVar60._4_4_ = (int)uVar2;
          auVar60._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
          auVar60._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar60._12_4_ = 0;
          fVar28 = *(float *)(lVar8 + 0x24 + lVar24);
          fVar41 = *(float *)(lVar8 + 0x28 + lVar24);
          fVar33 = *(float *)(lVar8 + 0x2c + lVar24);
          fVar44 = *(float *)(lVar8 + 0x30 + lVar24);
          fVar62 = fVar44 * fVar44 + fVar33 * fVar33 + fVar28 * fVar28 + fVar41 * fVar41;
          auVar57 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
          fVar46 = auVar57._0_4_;
          auVar67._4_12_ = auVar57._4_12_;
          fVar46 = fVar46 * fVar46 * fVar62 * -0.5 * fVar46 + fVar46 * 1.5;
          auVar57 = insertps(auVar60,ZEXT416((uint)(fVar28 * fVar46)),0x30);
          auVar59 = auVar57._0_12_;
          auVar30 = insertps(auVar29,ZEXT416((uint)(fVar41 * fVar46)),0x30);
          auVar67._0_4_ = fVar46 * fVar44;
          auVar57 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                             *(undefined4 *)(lVar8 + 4 + lVar24),0x10);
          in_XMM5 = insertps(auVar35,auVar67,0x30);
          auVar35 = insertps(auVar57,*(undefined4 *)(lVar8 + 0x3c + lVar24),0x20);
          in_XMM8 = insertps(auVar35,ZEXT416((uint)(fVar33 * fVar46)),0x30);
        }
        else if (iVar26 == 0x9244) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar30 = *(undefined1 (*) [16])(lVar8 + lVar24);
          in_XMM8 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar24);
          in_XMM5 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar24);
          auVar59 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar24),0);
        }
        fVar62 = in_XMM5._0_4_;
        fVar58 = in_XMM5._4_4_;
        fVar61 = in_XMM5._8_4_;
        fVar65 = in_XMM5._12_4_;
        fVar75 = in_XMM8._0_4_;
        fVar77 = in_XMM8._4_4_;
        fVar63 = in_XMM8._8_4_;
        fVar28 = auVar30._0_4_;
        fVar41 = auVar30._4_4_;
        fVar33 = auVar30._8_4_;
        auVar42._0_4_ = fVar75 * fVar58 - fVar77 * fVar62;
        fVar44 = fVar77 * fVar61 - fVar63 * fVar58;
        fVar46 = fVar63 * fVar62 - fVar75 * fVar61;
        auVar36._4_4_ = fVar46;
        auVar36._0_4_ = fVar44;
        auVar36._8_4_ = auVar42._0_4_;
        auVar36._12_4_ = in_XMM8._12_4_ * fVar65 - in_XMM8._12_4_ * fVar65;
        auVar56._0_4_ = fVar62 * fVar41 - fVar58 * fVar28;
        auVar56._4_4_ = fVar58 * fVar33 - fVar61 * fVar41;
        auVar56._8_4_ = fVar61 * fVar28 - fVar62 * fVar33;
        auVar56._12_4_ = fVar65 * auVar30._12_4_ - fVar65 * auVar30._12_4_;
        auVar35 = dpps(auVar30,auVar36,0x7f);
        fVar62 = fVar41 * fVar63 - fVar33 * fVar77;
        auVar57 = insertps(auVar56,auVar56,0x4a);
        auVar42._4_4_ = auVar56._0_4_;
        auVar42._8_4_ = fVar28 * fVar77 - fVar41 * fVar75;
        auVar42._12_4_ = 0;
        auVar50._4_4_ = fVar62;
        auVar50._0_4_ = fVar44;
        auVar50._8_4_ = fVar62;
        auVar50._12_4_ = auVar57._4_4_;
        auVar49._8_8_ = auVar50._8_8_;
        auVar49._4_4_ = auVar57._0_4_;
        auVar49._0_4_ = fVar44;
        auVar37._4_4_ = auVar57._8_4_;
        auVar37._0_4_ = fVar46;
        auVar37._8_4_ = fVar33 * fVar75 - fVar28 * fVar63;
        auVar37._12_4_ = auVar57._12_4_;
        auVar31._0_4_ = auVar35._0_4_;
        auVar31._4_4_ = auVar31._0_4_;
        auVar31._8_4_ = auVar31._0_4_;
        auVar31._12_4_ = auVar31._0_4_;
        auVar51 = divps(auVar49,auVar31);
        auVar35 = divps(auVar37,auVar31);
        auVar57 = divps(auVar42,auVar31);
        fVar28 = auVar59._0_4_;
        fVar41 = auVar59._4_4_;
        fVar33 = auVar59._8_4_;
        fVar40 = auVar57._0_4_;
        fVar45 = auVar57._4_4_;
        fVar47 = auVar57._8_4_;
        fVar34 = auVar35._0_4_;
        fVar38 = auVar35._4_4_;
        fVar39 = auVar35._8_4_;
        fVar48 = auVar51._0_4_;
        fVar53 = auVar51._4_4_;
        fVar54 = auVar51._8_4_;
        fVar64 = fVar28 * fVar48 + fVar41 * fVar34 + fVar33 * fVar40;
        fVar68 = fVar28 * fVar53 + fVar41 * fVar38 + fVar33 * fVar45;
        fVar70 = fVar28 * fVar54 + fVar41 * fVar39 + fVar33 * fVar47;
        fVar28 = *(float *)ray;
        fVar41 = *(float *)(ray + 4);
        uVar2 = *(undefined8 *)ray;
        fVar33 = *(float *)(ray + 8);
        fVar44 = *(float *)(ray + 0xc);
        uVar16 = *(undefined8 *)(ray + 8);
        pRVar1 = ray + 0x10;
        fVar46 = *(float *)pRVar1;
        fVar62 = *(float *)(ray + 0x14);
        fVar58 = *(float *)(ray + 0x18);
        auVar59 = *(undefined1 (*) [12])pRVar1;
        fVar61 = *(float *)(ray + 0x1c);
        auVar35 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x20;
        fVar65 = *(float *)pRVar1;
        fVar75 = *(float *)(ray + 0x24);
        fVar77 = *(float *)(ray + 0x28);
        auVar15 = *(undefined1 (*) [12])pRVar1;
        fVar63 = *(float *)(ray + 0x2c);
        auVar57 = *(undefined1 (*) [16])pRVar1;
        fVar66 = *(float *)(ray + 0x40);
        fVar69 = *(float *)(ray + 0x44);
        uVar17 = *(undefined8 *)(ray + 0x40);
        fVar71 = *(float *)(ray + 0x48);
        fVar78 = *(float *)(ray + 0x4c);
        uVar18 = *(undefined8 *)(ray + 0x48);
        fVar73 = *(float *)(ray + 0x50);
        fVar76 = *(float *)(ray + 0x54);
        uVar19 = *(undefined8 *)(ray + 0x50);
        fVar9 = *(float *)(ray + 0x58);
        fVar10 = *(float *)(ray + 0x5c);
        uVar20 = *(undefined8 *)(ray + 0x58);
        fVar11 = *(float *)(ray + 0x60);
        fVar12 = *(float *)(ray + 100);
        uVar21 = *(undefined8 *)(ray + 0x60);
        fVar13 = *(float *)(ray + 0x68);
        fVar14 = *(float *)(ray + 0x6c);
        uVar22 = *(undefined8 *)(ray + 0x68);
        *(float *)ray = fVar28 * fVar48 + fVar46 * fVar34 + (fVar65 * fVar40 - fVar64);
        *(float *)(ray + 4) = fVar41 * fVar48 + fVar62 * fVar34 + (fVar75 * fVar40 - fVar64);
        *(float *)(ray + 8) = fVar33 * fVar48 + fVar58 * fVar34 + (fVar77 * fVar40 - fVar64);
        *(float *)(ray + 0xc) = fVar44 * fVar48 + fVar61 * fVar34 + (fVar63 * fVar40 - fVar64);
        *(float *)(ray + 0x10) = fVar28 * fVar53 + fVar46 * fVar38 + (fVar65 * fVar45 - fVar68);
        *(float *)(ray + 0x14) = fVar41 * fVar53 + fVar62 * fVar38 + (fVar75 * fVar45 - fVar68);
        *(float *)(ray + 0x18) = fVar33 * fVar53 + fVar58 * fVar38 + (fVar77 * fVar45 - fVar68);
        *(float *)(ray + 0x1c) = fVar44 * fVar53 + fVar61 * fVar38 + (fVar63 * fVar45 - fVar68);
        *(float *)(ray + 0x20) = fVar28 * fVar54 + fVar46 * fVar39 + (fVar65 * fVar47 - fVar70);
        *(float *)(ray + 0x24) = fVar41 * fVar54 + fVar62 * fVar39 + (fVar75 * fVar47 - fVar70);
        *(float *)(ray + 0x28) = fVar33 * fVar54 + fVar58 * fVar39 + (fVar77 * fVar47 - fVar70);
        *(float *)(ray + 0x2c) = fVar44 * fVar54 + fVar61 * fVar39 + (fVar63 * fVar47 - fVar70);
        *(float *)(ray + 0x40) = fVar48 * fVar66 + fVar34 * fVar73 + fVar40 * fVar11;
        *(float *)(ray + 0x44) = fVar48 * fVar69 + fVar34 * fVar76 + fVar40 * fVar12;
        *(float *)(ray + 0x48) = fVar48 * fVar71 + fVar34 * fVar9 + fVar40 * fVar13;
        *(float *)(ray + 0x4c) = fVar48 * fVar78 + fVar34 * fVar10 + fVar40 * fVar14;
        *(float *)(ray + 0x50) = fVar53 * fVar66 + fVar38 * fVar73 + fVar45 * fVar11;
        *(float *)(ray + 0x54) = fVar53 * fVar69 + fVar38 * fVar76 + fVar45 * fVar12;
        *(float *)(ray + 0x58) = fVar53 * fVar71 + fVar38 * fVar9 + fVar45 * fVar13;
        *(float *)(ray + 0x5c) = fVar53 * fVar78 + fVar38 * fVar10 + fVar45 * fVar14;
        *(float *)(ray + 0x60) = fVar54 * fVar66 + fVar39 * fVar73 + fVar47 * fVar11;
        *(float *)(ray + 100) = fVar54 * fVar69 + fVar39 * fVar76 + fVar47 * fVar12;
        *(float *)(ray + 0x68) = fVar54 * fVar71 + fVar39 * fVar9 + fVar47 * fVar13;
        *(float *)(ray + 0x6c) = fVar54 * fVar78 + fVar39 * fVar10 + fVar47 * fVar14;
        local_20 = context->args;
        local_28 = pRVar6;
        (**(code **)(local_30 + 0xa0))(local_48,local_30 + 0x58,ray);
        *(undefined8 *)ray = uVar2;
        *(undefined8 *)(ray + 8) = uVar16;
        local_a8 = auVar59._0_8_;
        uStack_a0 = auVar35._8_8_;
        *(undefined8 *)(ray + 0x10) = local_a8;
        *(undefined8 *)(ray + 0x18) = uStack_a0;
        local_98 = auVar15._0_8_;
        uStack_90 = auVar57._8_8_;
        *(undefined8 *)(ray + 0x20) = local_98;
        *(undefined8 *)(ray + 0x28) = uStack_90;
        *(undefined8 *)(ray + 0x40) = uVar17;
        *(undefined8 *)(ray + 0x48) = uVar18;
        *(undefined8 *)(ray + 0x50) = uVar19;
        *(undefined8 *)(ray + 0x58) = uVar20;
        *(undefined8 *)(ray + 0x60) = uVar21;
        *(undefined8 *)(ray + 0x68) = uVar22;
        fVar28 = *(float *)(ray + 0x84);
        fVar41 = *(float *)(ray + 0x88);
        fVar33 = *(float *)(ray + 0x8c);
        *(uint *)this = -(uint)(*(float *)(ray + 0x80) < 0.0);
        *(uint *)(this + 4) = -(uint)(fVar28 < 0.0);
        *(uint *)(this + 8) = -(uint)(fVar41 < 0.0);
        *(uint *)(this + 0xc) = -(uint)(fVar33 < 0.0);
        pRVar6->instID[0] = 0xffffffff;
        pRVar6->instPrimID[0] = 0xffffffff;
        pGVar25 = extraout_RDX;
      }
      goto LAB_002b0cdd;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar2;
LAB_002b0cdd:
  vVar79.field_0._8_8_ = pGVar25;
  vVar79.field_0._0_8_ = this;
  return (vbool<4>)vVar79.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorK<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;    
    }